

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

SelectUtxosRequestStruct * __thiscall
cfd::js::api::json::SelectUtxosRequest::ConvertToStruct
          (SelectUtxosRequestStruct *__return_storage_ptr__,SelectUtxosRequest *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pUVar3;
  pointer pTVar4;
  pointer pUVar5;
  pointer pTVar6;
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  local_b8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  char local_68 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  __return_storage_ptr__->is_elements = false;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->target_amount = 0;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->fee_info).tx_fee_amount = 0;
  (__return_storage_ptr__->fee_info).fee_rate = 20.0;
  (__return_storage_ptr__->fee_info).long_term_fee_rate = 20.0;
  (__return_storage_ptr__->fee_info).knapsack_min_change = -1;
  (__return_storage_ptr__->fee_info).fee_asset._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fee_info).fee_asset.field_2;
  (__return_storage_ptr__->fee_info).fee_asset._M_string_length = 0;
  (__return_storage_ptr__->fee_info).fee_asset.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fee_info).exponent = 0;
  (__return_storage_ptr__->fee_info).minimum_bits = 0x34;
  p_Var1 = &(__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  core::JsonObjectVector<cfd::js::api::json::UtxoJsonData,_cfd::js::api::UtxoJsonDataStruct>::
  ConvertToStruct((vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
                   *)&local_b8,&this->utxos_);
  pUVar3 = (__return_storage_ptr__->utxos).
           super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_b8.
                super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98._0_8_ =
       (__return_storage_ptr__->utxos).
       super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pUVar5 = (__return_storage_ptr__->utxos).
           super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_b8.
                super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->utxos).
  super__Vector_base<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_b8.
                super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_98._8_4_ = SUB84(pUVar5,0);
  local_98._12_4_ = (undefined4)((ulong)pUVar5 >> 0x20);
  local_98._16_4_ = SUB84(pUVar3,0);
  local_98._20_4_ = (undefined4)((ulong)pUVar3 >> 0x20);
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  ~vector((vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
           *)local_98);
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  ~vector((vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
           *)&local_b8);
  __return_storage_ptr__->target_amount = this->target_amount_;
  __return_storage_ptr__->is_elements = this->is_elements_;
  core::
  JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
  ::ConvertToStruct(&local_b8,&this->targets_);
  pTVar4 = (__return_storage_ptr__->targets).
           super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98._0_8_ =
       (__return_storage_ptr__->targets).
       super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (__return_storage_ptr__->targets).
           super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->targets).
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98._8_4_ = SUB84(pTVar6,0);
  local_98._12_4_ = (undefined4)((ulong)pTVar6 >> 0x20);
  local_98._16_4_ = SUB84(pTVar4,0);
  local_98._20_4_ = (undefined4)((ulong)pTVar4 >> 0x20);
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::~vector((vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
             *)local_98);
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::~vector(&local_b8);
  CoinSelectionFeeInformationField::ConvertToStruct
            ((CoinSelectionFeeInformationFieldStruct *)local_98,&this->fee_info_);
  *(ulong *)((long)&(__return_storage_ptr__->fee_info).fee_rate + 4) =
       CONCAT44(local_98._16_4_,local_98._12_4_);
  *(ulong *)((long)&(__return_storage_ptr__->fee_info).long_term_fee_rate + 4) =
       CONCAT44(local_98._24_4_,local_98._20_4_);
  (__return_storage_ptr__->fee_info).tx_fee_amount = local_98._0_8_;
  (__return_storage_ptr__->fee_info).fee_rate = (double)CONCAT44(local_98._12_4_,local_98._8_4_);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->fee_info).fee_asset,(string *)&local_78);
  *(undefined8 *)&(__return_storage_ptr__->fee_info).exponent = local_68._16_8_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->fee_info).ignore_items._M_t);
  if (local_50._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_50._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_50._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_50._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_50._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_50._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->fee_info).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
         = local_50._M_impl.super__Rb_tree_header._M_node_count;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_50);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SelectUtxosRequestStruct SelectUtxosRequest::ConvertToStruct() const {  // NOLINT
  SelectUtxosRequestStruct result;
  result.utxos = utxos_.ConvertToStruct();
  result.target_amount = target_amount_;
  result.is_elements = is_elements_;
  result.targets = targets_.ConvertToStruct();
  result.fee_info = fee_info_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}